

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>_>
 __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::Make(TimeZoneInfo *this,string *name)

{
  bool bVar1;
  TimeZoneInfo *this_00;
  pointer __old_p;
  
  this_00 = (TimeZoneInfo *)operator_new(0xc0);
  TimeZoneInfo(this_00);
  (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)this_00;
  bVar1 = Load(this_00,name);
  if (!bVar1) {
    (this->super_TimeZoneIf)._vptr_TimeZoneIf = (_func_int **)0x0;
    (*(this_00->super_TimeZoneIf)._vptr_TimeZoneIf[1])(this_00);
  }
  return (__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneInfo> TimeZoneInfo::Make(const std::string& name) {
  auto tz = std::unique_ptr<TimeZoneInfo>(new TimeZoneInfo);
  if (!tz->Load(name)) tz.reset();  // fallback to UTC
  return tz;
}